

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GenDefaultValue
          (string *__return_storage_ptr__,TsGenerator *this,FieldDef *field,import_set *imports)

{
  _Rb_tree_color _Var1;
  Definition *pDVar2;
  import_set *piVar3;
  bool bVar4;
  _Rb_tree_header *p_Var5;
  EnumVal *s;
  char *pcVar6;
  allocator<char> local_323;
  allocator<char> local_322;
  allocator<char> local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  allocator<char> local_2fb;
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  string local_2f8;
  ImportDefinition local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  EnumVal *local_1e8;
  EnumVal *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string enum_value;
  undefined1 local_70 [8];
  string enum_name;
  int i;
  Value *value;
  allocator<char> local_29;
  import_set *local_28;
  import_set *imports_local;
  FieldDef *field_local;
  TsGenerator *this_local;
  string *ret;
  
  local_28 = imports;
  imports_local = (import_set *)field;
  field_local = (FieldDef *)this;
  this_local = (TsGenerator *)__return_storage_ptr__;
  bVar4 = FieldDef::IsScalarOptional(field);
  piVar3 = imports_local;
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    p_Var5 = &imports_local[4]._M_t._M_impl.super__Rb_tree_header;
    if (((imports_local[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_left == (_Base_ptr)0x0)
        || ((p_Var5->_M_header)._M_color == 0x10)) || ((p_Var5->_M_header)._M_color == 0xe)) {
      switch((p_Var5->_M_header)._M_color) {
      case 2:
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&imports_local[4]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                "0");
        pcVar6 = "true";
        if (bVar4) {
          pcVar6 = "false";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar6,&local_2f9);
        std::allocator<char>::~allocator(&local_2f9);
        break;
      default:
        bVar4 = StringIsFlatbufferNan
                          ((string *)
                           &imports_local[4]._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"NaN",&local_321);
          std::allocator<char>::~allocator(&local_321);
        }
        else {
          bVar4 = StringIsFlatbufferPositiveInfinity
                            ((string *)&piVar3[4]._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"Infinity",&local_322);
            std::allocator<char>::~allocator(&local_322);
          }
          else {
            bVar4 = StringIsFlatbufferNegativeInfinity
                              ((string *)&piVar3[4]._M_t._M_impl.super__Rb_tree_header._M_node_count
                              );
            if (bVar4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"-Infinity",&local_323);
              std::allocator<char>::~allocator(&local_323);
            }
            else {
              std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,
                         (string *)&piVar3[4]._M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
          }
        }
        break;
      case 9:
      case 10:
        std::operator+(&local_320,"BigInt(\'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &imports_local[4]._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::operator+(__return_storage_ptr__,&local_320,"\')");
        std::__cxx11::string::~string((string *)&local_320);
        break;
      case 0xd:
      case 0xf:
      case 0x10:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"null",&local_2fa);
        std::allocator<char>::~allocator(&local_2fa);
        break;
      case 0xe:
      case 0x11:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"[]",&local_2fb);
        std::allocator<char>::~allocator(&local_2fb);
      }
    }
    else {
      _Var1 = (p_Var5->_M_header)._M_color;
      if (_Var1 - 9 < 2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       "BigInt(\'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &imports_local[4]._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       "\')");
        std::__cxx11::string::~string((string *)&val);
      }
      else if (_Var1 == 0x11) {
        enum_name.field_2._M_local_buf[0xf] = '\0';
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"[",
                   (allocator<char> *)(enum_name.field_2._M_local_buf + 0xe));
        std::allocator<char>::~allocator((allocator<char> *)(enum_name.field_2._M_local_buf + 0xe));
        for (enum_name.field_2._8_4_ = 0;
            (int)enum_name.field_2._8_4_ <
            (int)(uint)*(ushort *)&piVar3[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            enum_name.field_2._8_4_ = enum_name.field_2._8_4_ + 1) {
          pDVar2 = (Definition *)piVar3[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          AddImport<flatbuffers::EnumDef>
                    ((ImportDefinition *)((long)&enum_value.field_2 + 8),this,local_28,pDVar2,
                     (EnumDef *)pDVar2);
          std::__cxx11::string::string
                    ((string *)local_70,(string *)(enum_value.field_2._M_local_buf + 8));
          anon_unknown_10::ImportDefinition::~ImportDefinition
                    ((ImportDefinition *)(enum_value.field_2._M_local_buf + 8));
          s = EnumDef::FindByValue
                        ((EnumDef *)piVar3[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                         (string *)&piVar3[4]._M_t._M_impl.super__Rb_tree_header._M_node_count);
          IdlNamer::Variant_abi_cxx11_((string *)local_160,&this->namer_,s);
          std::operator+(&local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,".");
          std::operator+(&local_1a0,&local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160);
          pcVar6 = "";
          if ((int)enum_name.field_2._8_4_ <
              (int)(*(ushort *)&piVar3[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_right - 1)
             ) {
            pcVar6 = ", ";
          }
          std::operator+(&local_180,&local_1a0,pcVar6);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)local_160);
          std::__cxx11::string::~string((string *)local_70);
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
      }
      else {
        local_1e8 = EnumDef::FindByValue
                              ((EnumDef *)
                               imports_local[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                               ,(string *)
                                &imports_local[4]._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (local_1e8 == (EnumVal *)0x0) {
          local_1e8 = EnumDef::MinValue((EnumDef *)
                                        piVar3[4]._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_left);
        }
        pDVar2 = (Definition *)piVar3[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        AddImport<flatbuffers::EnumDef>(&local_2d8,this,local_28,pDVar2,(EnumDef *)pDVar2);
        std::operator+(&local_208,&local_2d8.name,".");
        IdlNamer::Variant_abi_cxx11_(&local_2f8,&this->namer_,local_1e8);
        std::operator+(__return_storage_ptr__,&local_208,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_208);
        anon_unknown_10::ImportDefinition::~ImportDefinition(&local_2d8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const FieldDef &field, import_set &imports) {
    if (field.IsScalarOptional()) { return "null"; }

    const auto &value = field.value;
    if (value.type.enum_def && value.type.base_type != BASE_TYPE_UNION &&
        value.type.base_type != BASE_TYPE_VECTOR) {
      switch (value.type.base_type) {
        case BASE_TYPE_ARRAY: {
          std::string ret = "[";
          for (auto i = 0; i < value.type.fixed_length; ++i) {
            std::string enum_name =
                AddImport(imports, *value.type.enum_def, *value.type.enum_def)
                    .name;
            std::string enum_value = namer_.Variant(
                *value.type.enum_def->FindByValue(value.constant));
            ret += enum_name + "." + enum_value +
                   (i < value.type.fixed_length - 1 ? ", " : "");
          }
          ret += "]";
          return ret;
        }
        case BASE_TYPE_LONG:
        case BASE_TYPE_ULONG: {
          // If the value is an enum with a 64-bit base type, we have to just
          // return the bigint value directly since typescript does not support
          // enums with bigint backing types.
          return "BigInt('" + value.constant + "')";
        }
        default: {
          EnumVal *val = value.type.enum_def->FindByValue(value.constant);
          if (val == nullptr)
            val = const_cast<EnumVal *>(value.type.enum_def->MinValue());
          return AddImport(imports, *value.type.enum_def, *value.type.enum_def)
                     .name +
                 "." + namer_.Variant(*val);
        }
      }
    }

    switch (value.type.base_type) {
      case BASE_TYPE_BOOL: return value.constant == "0" ? "false" : "true";

      case BASE_TYPE_STRING:
      case BASE_TYPE_UNION:
      case BASE_TYPE_STRUCT: {
        return "null";
      }

      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR: return "[]";

      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG: {
        return "BigInt('" + value.constant + "')";
      }

      default: {
        if (StringIsFlatbufferNan(value.constant)) {
          return "NaN";
        } else if (StringIsFlatbufferPositiveInfinity(value.constant)) {
          return "Infinity";
        } else if (StringIsFlatbufferNegativeInfinity(value.constant)) {
          return "-Infinity";
        }
        return value.constant;
      }
    }
  }